

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_initialize_U(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                *this)

{
  uint uVar1;
  Index IVar2;
  uint local_2c;
  initializer_list<unsigned_int> local_28;
  uint local_18;
  uint local_14;
  ID_index i;
  type_conflict1 id;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *this_local;
  
  local_18 = 0;
  _i = this;
  while( true ) {
    uVar1 = local_18;
    IVar2 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            ::get_number_of_columns(&this->reducedMatrixR_);
    if (IVar2 <= uVar1) break;
    local_14 = local_18;
    local_2c = local_18;
    local_28._M_array = &local_2c;
    local_28._M_len = 1;
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>
    ::insert_column<std::initializer_list<unsigned_int>>
              ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>
                *)&this->mirrorMatrixU_,&local_28);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_initialize_U()
{
  typename std::conditional<Master_matrix::Option_list::is_z2, Index, std::pair<Index, Field_element> >::type id;
  if constexpr (!Master_matrix::Option_list::is_z2) id.second = 1;

  for (ID_index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if constexpr (Master_matrix::Option_list::is_z2)
      id = i;
    else
      id.first = i;
    mirrorMatrixU_.insert_column({id});
  }
}